

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportSet.cxx
# Opt level: O0

void __thiscall cmExportSet::Compute(cmExportSet *this,cmLocalGenerator *lg)

{
  cmTargetExport *name;
  bool bVar1;
  reference ppcVar2;
  cmGeneratorTarget *pcVar3;
  cmTargetExport *tgtExport;
  iterator __end1;
  iterator __begin1;
  vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_> *__range1;
  cmLocalGenerator *lg_local;
  cmExportSet *this_local;
  
  __end1 = std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::begin
                     (&this->TargetExports);
  tgtExport = (cmTargetExport *)
              std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>::end
                        (&this->TargetExports);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
                                *)&tgtExport);
    if (!bVar1) break;
    ppcVar2 = __gnu_cxx::
              __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
              ::operator*(&__end1);
    name = *ppcVar2;
    pcVar3 = cmLocalGenerator::FindGeneratorTargetToUse(lg,&name->TargetName);
    name->Target = pcVar3;
    __gnu_cxx::
    __normal_iterator<cmTargetExport_**,_std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>_>
    ::operator++(&__end1);
  }
  return;
}

Assistant:

void cmExportSet::Compute(cmLocalGenerator* lg)
{
  for (cmTargetExport* tgtExport : this->TargetExports) {
    tgtExport->Target = lg->FindGeneratorTargetToUse(tgtExport->TargetName);
  }
}